

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

int Aig_ManLevelNum(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_20;
  int local_1c;
  int LevelsMax;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vCos), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_1c);
    pAVar2 = Aig_ObjFanin0(pAVar2);
    local_20 = Abc_MaxInt(local_20,(uint)((ulong)*(undefined8 *)&pAVar2->field_0x18 >> 0x20) &
                                   0xffffff);
  }
  return local_20;
}

Assistant:

int Aig_ManLevelNum( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, LevelsMax;
    LevelsMax = 0;
    Aig_ManForEachCo( p, pObj, i )
        LevelsMax = Abc_MaxInt( LevelsMax, (int)Aig_ObjFanin0(pObj)->Level );
    return LevelsMax;
}